

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM_x86::forward_int8
          (LSTM_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _h;
  int iVar1;
  uint reverse;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  ulong uVar2;
  pointer pMVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined8 uVar29;
  int _h_00;
  size_t sVar36;
  void *in_R8;
  int iVar37;
  Mat local_488;
  Mat m_5;
  Mat local_3e8;
  Mat local_398;
  Option opt_quant;
  Mat m_6;
  Mat m_4;
  Mat m_2;
  Mat m_3;
  Mat m_1;
  Mat m_8;
  Mat m_9;
  Mat local_78;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined3 uVar32;
  undefined1 uVar33;
  undefined2 uVar34;
  undefined1 uVar35;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = (this->super_LSTM).direction;
  local_398.cstep = 0;
  local_398.data = (void *)0x0;
  local_398.refcount._0_4_ = 0;
  local_398.refcount._4_4_ = 0;
  local_398.elemsize._0_4_ = 0;
  local_398.elemsize._4_4_ = 0;
  local_398.elempack = 0;
  local_398.allocator = (Allocator *)0x0;
  local_398.dims = 0;
  local_398.w = 0;
  local_398.h = 0;
  local_398.d = 0;
  local_398.c = 0;
  local_3e8.cstep = 0;
  local_3e8.data = (void *)0x0;
  local_3e8.refcount._0_4_ = 0;
  local_3e8.refcount._4_4_ = 0;
  local_3e8.elemsize._0_4_ = 0;
  local_3e8.elemsize._4_4_ = 0;
  local_3e8.elempack = 0;
  local_3e8.allocator = (Allocator *)0x0;
  local_3e8.dims = 0;
  local_3e8.w = 0;
  local_3e8.h = 0;
  local_3e8.d = 0;
  local_3e8.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&local_488,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar4 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_398.allocator == (Allocator *)0x0) {
          if (local_398.data != (void *)0x0) {
            free(local_398.data);
          }
        }
        else {
          (*(local_398.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
    local_398.data = local_488.data;
    local_398.refcount._0_4_ = local_488.refcount._0_4_;
    local_398.refcount._4_4_ = local_488.refcount._4_4_;
    local_398.elemsize._0_4_ = (undefined4)local_488.elemsize;
    local_398.elemsize._4_4_ = local_488.elemsize._4_4_;
    local_398.elempack = local_488.elempack;
    local_398.allocator = local_488.allocator;
    local_398.dims = local_488.dims;
    local_398.w = local_488.w;
    local_398.h = local_488.h;
    local_398.d = local_488.d;
    local_398.c = local_488.c;
    local_398.cstep = local_488.cstep;
    sVar36 = local_488.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_488.allocator == (Allocator *)0x0) {
          if (local_488.data != (void *)0x0) {
            free(local_488.data);
            sVar36 = local_488.cstep;
          }
        }
        else {
          (*(local_488.allocator)->_vptr_Allocator[3])();
          sVar36 = local_488.cstep;
        }
      }
    }
    local_488.cstep = 0;
    local_488.data = (void *)0x0;
    local_488.refcount._0_4_ = 0;
    local_488.refcount._4_4_ = 0;
    local_488.elemsize._0_4_ = 0;
    local_488.elemsize._4_4_ = 0;
    local_488.elempack = 0;
    local_488.dims = 0;
    local_488.w = 0;
    local_488.h = 0;
    local_488.d = 0;
    local_488.c = 0;
    Mat::clone(&local_488,
               (__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar36,in_R8);
    piVar4 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_3e8.allocator == (Allocator *)0x0) {
          if (local_3e8.data != (void *)0x0) {
            free(local_3e8.data);
          }
        }
        else {
          (*(local_3e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
    local_3e8.data = local_488.data;
    local_3e8.refcount._0_4_ = local_488.refcount._0_4_;
    local_3e8.refcount._4_4_ = local_488.refcount._4_4_;
    local_3e8.elemsize._0_4_ = (undefined4)local_488.elemsize;
    local_3e8.elemsize._4_4_ = local_488.elemsize._4_4_;
    local_3e8.elempack = local_488.elempack;
    local_3e8.allocator = local_488.allocator;
    local_3e8.dims = local_488.dims;
    local_3e8.w = local_488.w;
    local_3e8.h = local_488.h;
    local_3e8.d = local_488.d;
    local_3e8.c = local_488.c;
    local_3e8.cstep = local_488.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_488.allocator == (Allocator *)0x0) {
          if (local_488.data != (void *)0x0) {
            free(local_488.data);
          }
        }
        else {
          (*(local_488.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_488.cstep = 0;
    local_488.data = (void *)0x0;
    local_488.refcount._0_4_ = 0;
    local_488.refcount._4_4_ = 0;
    local_488.elemsize._0_4_ = 0;
    local_488.elemsize._4_4_ = 0;
    local_488.elempack = 0;
    local_488.dims = 0;
    local_488.w = 0;
    local_488.h = 0;
    local_488.d = 0;
    local_488.c = 0;
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_398,(this->super_LSTM).num_output,_h_00,4,_allocator);
    iVar37 = -100;
    if ((local_398.data == (void *)0x0) || ((long)local_398.c * local_398.cstep == 0))
    goto LAB_003829f0;
    if (0 < local_398.c * (int)local_398.cstep) {
      memset(local_398.data,0,(ulong)(uint)(local_398.c * (int)local_398.cstep) << 2);
    }
    Mat::create(&local_3e8,(this->super_LSTM).hidden_size,_h_00,4,_allocator);
    if ((local_3e8.data == (void *)0x0) || ((long)local_3e8.c * local_3e8.cstep == 0))
    goto LAB_003829f0;
    if (0 < local_3e8.c * (int)local_3e8.cstep) {
      memset(local_3e8.data,0,(ulong)(uint)(local_3e8.c * (int)local_3e8.cstep) << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar37 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_488.cstep = 0;
    local_488.data = (void *)0x0;
    local_488.refcount._0_4_ = 0;
    local_488.refcount._4_4_ = 0;
    local_488.elemsize._0_4_ = 0;
    local_488.elemsize._4_4_ = 0;
    local_488.elempack = 0;
    local_488.allocator = (Allocator *)0x0;
    local_488.dims = 0;
    local_488.w = 0;
    local_488.h = 0;
    local_488.d = 0;
    local_488.c = 0;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar5 = opt->openmp_blocktime;
    uVar6 = opt->use_winograd_convolution;
    uVar8 = opt->use_sgemm_convolution;
    uVar10 = opt->use_int8_inference;
    uVar12 = opt->use_vulkan_compute;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar2._0_1_ = opt->use_bf16_storage;
    uVar2._1_1_ = opt->use_fp16_packed;
    uVar2._2_1_ = opt->use_fp16_storage;
    uVar2._3_1_ = opt->use_fp16_arithmetic;
    uVar2._4_1_ = opt->use_int8_packed;
    uVar2._5_1_ = opt->use_int8_storage;
    uVar2._6_1_ = opt->use_int8_arithmetic;
    uVar2._7_1_ = opt->use_packing_layout;
    uVar13 = opt->vulkan_device_index;
    uVar14 = opt->use_reserved_1;
    uVar16 = opt->use_image_storage;
    uVar18 = opt->use_tensor_storage;
    uVar20 = opt->use_reserved_2;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar15 = CONCAT31(uVar17,uVar14);
    uVar21 = opt->flush_denormals;
    uVar22 = opt->use_local_pool_allocator;
    uVar24 = opt->use_shader_local_memory;
    uVar26 = opt->use_cooperative_matrix;
    uVar28 = opt->use_winograd23_convolution;
    uVar27 = CONCAT11(uVar28,uVar26);
    uVar25 = CONCAT21(uVar27,uVar24);
    uVar23 = CONCAT31(uVar25,uVar22);
    uVar29._0_1_ = opt->use_winograd43_convolution;
    uVar29._1_1_ = opt->use_winograd63_convolution;
    uVar29._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar29._3_1_ = opt->use_fp16_uniform;
    uVar30 = opt->use_int8_uniform;
    uVar31 = opt->use_reserved_9;
    uVar33 = opt->use_reserved_10;
    uVar35 = opt->use_reserved_11;
    uVar34 = CONCAT11(uVar35,uVar33);
    uVar32 = CONCAT21(uVar34,uVar31);
    uVar29._4_4_ = CONCAT31(uVar32,uVar30);
    opt_quant._56_4_ = SUB84(uVar29,0);
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant._32_8_ = uVar2 & 0xffffffffffffff;
    opt_quant.openmp_blocktime = uVar5;
    opt_quant._28_4_ = uVar7;
    opt_quant.vulkan_device_index = uVar13;
    opt_quant._44_4_ = uVar15;
    opt_quant.flush_denormals = uVar21;
    opt_quant._52_4_ = uVar23;
    opt_quant._60_4_ = uVar29._4_4_;
    lstm_dynamic_quantize(bottom_blob,&local_488,&local_78,&opt_quant);
    reverse = (this->super_LSTM).direction;
    if (reverse < 2) {
      opt_quant._44_4_ = (this->weight_data_tm).w;
      opt_quant.flush_denormals = (this->weight_data_tm).h;
      opt_quant._56_4_ = (this->weight_data_tm).d;
      opt_quant._0_8_ = (this->weight_data_tm).data;
      sVar36 = (this->weight_data_tm).elemsize;
      opt_quant.openmp_blocktime = (this->weight_data_tm).elempack;
      opt_quant._32_8_ = (this->weight_data_tm).allocator;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = (undefined4)sVar36;
      opt_quant.workspace_allocator._4_4_ = (undefined4)(sVar36 >> 0x20);
      opt_quant.use_local_pool_allocator = true;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.vulkan_device_index = (this->weight_data_tm).dims + -1;
      m_1.w = (this->weight_data_tm_int8_descales).w;
      m_1.h = (this->weight_data_tm_int8_descales).h;
      m_1.c = (this->weight_data_tm_int8_descales).d;
      m_1.data = (this->weight_data_tm_int8_descales).data;
      uVar2 = (this->weight_data_tm_int8_descales).elemsize;
      m_1.elempack = (this->weight_data_tm_int8_descales).elempack;
      m_1.allocator = (this->weight_data_tm_int8_descales).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar2;
      m_1.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      m_1.d = 1;
      iVar1 = (this->weight_data_tm_int8_descales).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar2 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar2;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->bias_c_data_packed).w;
      m_2.h = (this->bias_c_data_packed).h;
      m_2.c = (this->bias_c_data_packed).d;
      m_2.data = (this->bias_c_data_packed).data;
      uVar2 = (this->bias_c_data_packed).elemsize;
      m_2.elempack = (this->bias_c_data_packed).elempack;
      m_2.allocator = (this->bias_c_data_packed).allocator;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar2;
      m_2.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      m_2.d = 1;
      sVar36 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->bias_c_data_packed).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (uVar2 * sVar36 + 0xf & 0xfffffffffffffff0) / uVar2;
      if (iVar1 == 4) {
        m_2.cstep = sVar36;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar2 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar2;
        m_3.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
        m_3.d = 1;
        iVar1 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar1 + -1;
        m_3.cstep = (uVar2 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar2;
        if (iVar1 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      lstm_int8(&local_488,&local_78,this_00,reverse,(Mat *)&opt_quant,&m_1,&m_2,&m_3,&local_398,
                &local_3e8,opt);
      piVar4 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            if (m_3.data != (void *)0x0) {
              free(m_3.data);
            }
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar4 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (opt_quant._32_8_ == 0) {
            if (opt_quant._0_8_ != 0) {
              free((void *)opt_quant._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      opt_quant.lightmode = false;
      opt_quant.use_shader_pack8 = false;
      opt_quant.use_subgroup_ops = false;
      opt_quant.use_reserved_0 = false;
      opt_quant.num_threads = 0;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = 0;
      opt_quant.workspace_allocator._4_4_ = 0;
      opt_quant.openmp_blocktime = 0;
      opt_quant.vulkan_device_index = 0;
      opt_quant.use_reserved_1 = false;
      opt_quant.use_image_storage = false;
      opt_quant.use_tensor_storage = false;
      opt_quant.use_reserved_2 = false;
      opt_quant.flush_denormals = 0;
      opt_quant.use_local_pool_allocator = false;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.use_winograd43_convolution = false;
      opt_quant.use_winograd63_convolution = false;
      opt_quant.use_a53_a55_optimized_kernel = false;
      opt_quant.use_fp16_uniform = false;
    }
    if ((this->super_LSTM).direction == 2) {
      opt_quant.lightmode = false;
      opt_quant.use_shader_pack8 = false;
      opt_quant.use_subgroup_ops = false;
      opt_quant.use_reserved_0 = false;
      opt_quant.num_threads = 0;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = 0;
      opt_quant.workspace_allocator._4_4_ = 0;
      opt_quant.openmp_blocktime = 0;
      opt_quant.use_bf16_storage = false;
      opt_quant.use_fp16_packed = false;
      opt_quant.use_fp16_storage = false;
      opt_quant.use_fp16_arithmetic = false;
      opt_quant.use_int8_packed = false;
      opt_quant.use_int8_storage = false;
      opt_quant.use_int8_arithmetic = false;
      opt_quant.use_packing_layout = false;
      opt_quant.vulkan_device_index = 0;
      opt_quant.use_reserved_1 = false;
      opt_quant.use_image_storage = false;
      opt_quant.use_tensor_storage = false;
      opt_quant.use_reserved_2 = false;
      opt_quant.flush_denormals = 0;
      opt_quant.use_local_pool_allocator = false;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.use_winograd43_convolution = false;
      opt_quant.use_winograd63_convolution = false;
      opt_quant.use_a53_a55_optimized_kernel = false;
      opt_quant.use_fp16_uniform = false;
      Mat::create((Mat *)&opt_quant,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
      piVar4 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (opt_quant._32_8_ == 0) {
            if (opt_quant._0_8_ != 0) {
              free((void *)opt_quant._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
          }
        }
      }
      opt_quant.lightmode = false;
      opt_quant.use_shader_pack8 = false;
      opt_quant.use_subgroup_ops = false;
      opt_quant.use_reserved_0 = false;
      opt_quant.num_threads = 0;
      opt_quant.blob_allocator._0_4_ = 0;
      opt_quant.blob_allocator._4_4_ = 0;
      opt_quant.workspace_allocator._0_4_ = 0;
      opt_quant.workspace_allocator._4_4_ = 0;
      opt_quant.openmp_blocktime = 0;
      opt_quant.vulkan_device_index = 0;
      opt_quant.use_reserved_1 = false;
      opt_quant.use_image_storage = false;
      opt_quant.use_tensor_storage = false;
      opt_quant.use_reserved_2 = false;
      opt_quant.flush_denormals = 0;
      opt_quant.use_local_pool_allocator = false;
      opt_quant.use_shader_local_memory = false;
      opt_quant.use_cooperative_matrix = false;
      opt_quant.use_winograd23_convolution = false;
      opt_quant.use_winograd43_convolution = false;
      opt_quant.use_winograd63_convolution = false;
      opt_quant.use_a53_a55_optimized_kernel = false;
      opt_quant.use_fp16_uniform = false;
      iVar37 = -100;
    }
    else {
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar37 = 0;
      if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar3 == 0xd8) {
        if (pMVar3 + 1 != &local_398) {
          piVar4 = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar3[1].refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar3[1].allocator == (Allocator *)0x0) {
                if (pMVar3[1].data != (void *)0x0) {
                  free(pMVar3[1].data);
                }
              }
              else {
                (*(pMVar3[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar3[1].cstep = 0;
          *(undefined8 *)((long)&pMVar3[1].refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3[1].elemsize + 4) = 0;
          pMVar3[1].data = (void *)0x0;
          pMVar3[1].refcount = (int *)0x0;
          pMVar3[1].dims = 0;
          pMVar3[1].w = 0;
          pMVar3[1].h = 0;
          pMVar3[1].d = 0;
          pMVar3[1].c = 0;
          pMVar3[1].data = local_398.data;
          pMVar3[1].refcount = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
          pMVar3[1].elemsize = CONCAT44(local_398.elemsize._4_4_,(undefined4)local_398.elemsize);
          pMVar3[1].elempack = local_398.elempack;
          pMVar3[1].allocator = local_398.allocator;
          pMVar3[1].dims = local_398.dims;
          pMVar3[1].w = local_398.w;
          pMVar3[1].h = local_398.h;
          pMVar3[1].d = local_398.d;
          pMVar3[1].c = local_398.c;
          pMVar3[1].cstep = local_398.cstep;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pMVar3 + 2 != &local_3e8) {
          piVar4 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar3[2].refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar3[2].allocator == (Allocator *)0x0) {
                if (pMVar3[2].data != (void *)0x0) {
                  free(pMVar3[2].data);
                }
              }
              else {
                (*(pMVar3[2].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar3[2].cstep = 0;
          *(undefined8 *)((long)&pMVar3[2].refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3[2].elemsize + 4) = 0;
          pMVar3[2].data = (void *)0x0;
          pMVar3[2].refcount = (int *)0x0;
          pMVar3[2].dims = 0;
          pMVar3[2].w = 0;
          pMVar3[2].h = 0;
          pMVar3[2].d = 0;
          pMVar3[2].c = 0;
          pMVar3[2].data = local_3e8.data;
          pMVar3[2].refcount = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_);
          pMVar3[2].elemsize = CONCAT44(local_3e8.elemsize._4_4_,(undefined4)local_3e8.elemsize);
          pMVar3[2].elempack = local_3e8.elempack;
          pMVar3[2].allocator = local_3e8.allocator;
          pMVar3[2].dims = local_3e8.dims;
          pMVar3[2].w = local_3e8.w;
          pMVar3[2].h = local_3e8.h;
          pMVar3[2].d = local_3e8.d;
          pMVar3[2].c = local_3e8.c;
          pMVar3[2].cstep = local_3e8.cstep;
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    piVar4 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_488.allocator == (Allocator *)0x0) {
          if (local_488.data != (void *)0x0) {
            free(local_488.data);
          }
        }
        else {
          (*(local_488.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_488.cstep = 0;
    local_488.data = (void *)0x0;
    local_488.refcount._0_4_ = 0;
    local_488.refcount._4_4_ = 0;
    local_488.elemsize._0_4_ = 0;
    local_488.elemsize._4_4_ = 0;
    local_488.elempack = 0;
    local_488.dims = 0;
    local_488.w = 0;
    local_488.h = 0;
    local_488.d = 0;
    local_488.c = 0;
  }
LAB_003829f0:
  piVar4 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_3e8.allocator == (Allocator *)0x0) {
        if (local_3e8.data != (void *)0x0) {
          free(local_3e8.data);
        }
      }
      else {
        (*(local_3e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_3e8.cstep = 0;
  local_3e8.data = (void *)0x0;
  local_3e8.refcount._0_4_ = 0;
  local_3e8.refcount._4_4_ = 0;
  local_3e8.elemsize._0_4_ = 0;
  local_3e8.elemsize._4_4_ = 0;
  local_3e8.elempack = 0;
  local_3e8.dims = 0;
  local_3e8.w = 0;
  local_3e8.h = 0;
  local_3e8.d = 0;
  local_3e8.c = 0;
  piVar4 = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_398.allocator == (Allocator *)0x0) {
        if (local_398.data != (void *)0x0) {
          free(local_398.data);
        }
      }
      else {
        (*(local_398.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int LSTM_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];

    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8;
    Mat bottom_blob_int8_descales;
    {
        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        lstm_dynamic_quantize(bottom_blob, bottom_blob_int8, bottom_blob_int8_descales, opt_quant);
    }

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob, direction, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_forward, 0, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_reverse, 1, weight_data_tm.channel(1), weight_data_tm_int8_descales.channel(1), bias_c_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}